

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

TestCaseProperties __thiscall
Catch::anon_unknown_26::parseSpecialTag(anon_unknown_26 *this,StringRef tag)

{
  bool bVar1;
  TestCaseProperties TVar2;
  StringRef other;
  StringRef other_00;
  StringRef other_01;
  StringRef other_02;
  StringRef other_03;
  StringRef tag_local;
  
  tag_local.m_size = (size_type)tag.m_start;
  if (((char *)tag_local.m_size == (char *)0x0) ||
     (TVar2 = IsHidden, *this != (anon_unknown_26)0x2e)) {
    other.m_size = 7;
    other.m_start = "!throws";
    tag_local.m_start = (char *)this;
    bVar1 = StringRef::operator==(&tag_local,other);
    TVar2 = Throws;
    if (!bVar1) {
      other_00.m_size = 0xb;
      other_00.m_start = "!shouldfail";
      bVar1 = StringRef::operator==(&tag_local,other_00);
      TVar2 = ShouldFail;
      if (!bVar1) {
        other_01.m_size = 8;
        other_01.m_start = "!mayfail";
        bVar1 = StringRef::operator==(&tag_local,other_01);
        TVar2 = MayFail;
        if (!bVar1) {
          other_02.m_size = 0xc;
          other_02.m_start = "!nonportable";
          bVar1 = StringRef::operator==(&tag_local,other_02);
          TVar2 = NonPortable;
          if (!bVar1) {
            other_03.m_size = 10;
            other_03.m_start = "!benchmark";
            bVar1 = StringRef::operator==(&tag_local,other_03);
            TVar2 = Benchmark|IsHidden;
            if (!bVar1) {
              TVar2 = None;
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TestCaseProperties parseSpecialTag( StringRef tag ) {
            if( !tag.empty() && tag[0] == '.' )
                return TestCaseProperties::IsHidden;
            else if( tag == "!throws"_sr )
                return TestCaseProperties::Throws;
            else if( tag == "!shouldfail"_sr )
                return TestCaseProperties::ShouldFail;
            else if( tag == "!mayfail"_sr )
                return TestCaseProperties::MayFail;
            else if( tag == "!nonportable"_sr )
                return TestCaseProperties::NonPortable;
            else if( tag == "!benchmark"_sr )
                return TestCaseProperties::Benchmark | TestCaseProperties::IsHidden;
            else
                return TestCaseProperties::None;
        }